

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O3

void __thiscall
nuraft::raft_server::commit_conf(raft_server *this,ulong idx_to_commit,ptr<log_entry> *le)

{
  element_type *peVar1;
  context *pcVar2;
  element_type *peVar3;
  int iVar4;
  buffer *pbVar5;
  ptr<cluster_config> new_conf;
  ptr<cluster_config> cur_conf;
  unique_lock<std::recursive_mutex> guard;
  uint64_t log_idx;
  undefined1 local_88 [20];
  __int_type_conflict _Stack_74;
  undefined4 local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [32];
  undefined1 local_38;
  EventAwaiter *local_30;
  string *local_28;
  
  local_58._24_8_ = &this->lock_;
  local_38 = 0;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)(local_58 + 0x18));
  local_38 = 1;
  pbVar5 = log_entry::get_buf((le->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
  buffer::pos(pbVar5,0);
  pbVar5 = log_entry::get_buf((le->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
  cluster_config::deserialize((cluster_config *)local_88,pbVar5);
  get_config((raft_server *)local_58);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar4 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (3 < iVar4) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)(local_88 + 0x10),
                 "config at index %lu is committed, prev config log idx %lu",
                 *(ulong *)local_88._0_8_,*(ulong *)local_58._0_8_);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit_conf",0x19a,local_88 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(_Stack_74,local_88._16_4_) != &local_68) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(_Stack_74,local_88._16_4_));
      }
    }
  }
  this->config_changing_ = false;
  if (*(ulong *)local_58._0_8_ < *(ulong *)local_88._0_8_) {
    (**(code **)(**(long **)&(((this->ctx_)._M_t.
                               super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                               .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                             state_mgr_).
                             super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2> +
                0x18))();
    reconfigure(this,(ptr<cluster_config> *)local_88);
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar4 = (**(code **)(*(long *)peVar1 + 0x38))();
      if (3 < iVar4) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)(local_88 + 0x10),"skipped config %lu, latest config %lu",
                   *(ulong *)local_88._0_8_,*(ulong *)local_58._0_8_);
        (**(code **)(*(long *)peVar1 + 0x40))
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_conf",0x1a3,local_88 + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(_Stack_74,local_88._16_4_) != &local_68) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(_Stack_74,local_88._16_4_));
        }
      }
    }
  }
  local_88._16_4_ = this->id_;
  _Stack_74 = (this->leader_).super___atomic_base<int>._M_i;
  local_70 = 0xffffffff;
  local_68._M_allocated_capacity = (size_type)&local_30;
  pcVar2 = (this->ctx_)._M_t.
           super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
           super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
           super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
  local_30 = (EventAwaiter *)idx_to_commit;
  if ((pcVar2->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_58._20_4_ = 9;
    local_28 = (string *)(local_88 + 0x10);
    (*(pcVar2->cb_func_).func._M_invoker)
              ((_Any_data *)&pcVar2->cb_func_,(Type *)(local_58 + 0x14),(Param **)&local_28);
  }
  peVar3 = (this->state_machine_).
           super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar3->_vptr_state_machine[4])(peVar3,idx_to_commit,local_88);
  if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)(local_58 + 0x18));
  return;
}

Assistant:

void raft_server::commit_conf(ulong idx_to_commit,
                              ptr<log_entry>& le) {
    recur_lock(lock_);
    le->get_buf().pos(0);
    ptr<cluster_config> new_conf =
        cluster_config::deserialize(le->get_buf());

    ptr<cluster_config> cur_conf = get_config();
    p_in( "config at index %" PRIu64 " is committed, prev config log idx %" PRIu64 "",
          new_conf->get_log_idx(), cur_conf->get_log_idx() );

    config_changing_ = false;
    if (cur_conf->get_log_idx() < new_conf->get_log_idx()) {
        // WARNING: Should not overwrite newer config with older one.
        ctx_->state_mgr_->save_config(*new_conf);
        reconfigure(new_conf);
    } else {
        p_in( "skipped config %" PRIu64 ", latest config %" PRIu64 "",
              new_conf->get_log_idx(), cur_conf->get_log_idx() );
    }

    cb_func::Param param(id_, leader_);
    uint64_t log_idx = idx_to_commit;
    param.ctx = &log_idx;
    ctx_->cb_func_.call(cb_func::NewConfig, &param);

    state_machine_->commit_config(idx_to_commit, new_conf);

    // Modified by Jung-Sang Ahn, May 18 2018:
    //   This causes an endless catch-up issue when we add a new node,
    //   as configuration always has itself in it.
    //   Instead, we can clear catch-up flag when this node receives
    //   normal append_entries() request, as receiving log entry
    //   means that catch-up process is already done.
    //
    // if (catching_up_ && new_conf->get_server(id_) != nilptr) {
    //     p_in("this server is committed as one of cluster members");
    //     catching_up_ = false;
    // }
}